

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O2

UnicodeSet * __thiscall
icu_63::Transliterator::getSourceSet(Transliterator *this,UnicodeSet *result)

{
  _func_int **pp_Var1;
  UnicodeSet *this_00;
  UnicodeSet *pUVar2;
  
  pUVar2 = result;
  (*(this->super_UObject)._vptr_UObject[0xf])();
  this_00 = (UnicodeSet *)this->filter;
  if (this_00 != (UnicodeSet *)0x0) {
    pp_Var1 = (this_00->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject;
    if (pp_Var1 != (_func_int **)&PTR__UnicodeSet_00471cc8) {
      this_00 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar2);
      if (this_00 == (UnicodeSet *)0x0) {
        return result;
      }
      UnicodeSet::UnicodeSet(this_00);
      (*(this->filter->super_UnicodeMatcher)._vptr_UnicodeMatcher[5])
                (&this->filter->super_UnicodeMatcher,this_00);
    }
    pUVar2 = this_00;
    UnicodeSet::retainAll(result,this_00);
    if (pp_Var1 != (_func_int **)&PTR__UnicodeSet_00471cc8) {
      UnicodeSet::~UnicodeSet(this_00);
      UMemory::operator_delete((UMemory *)this_00,pUVar2);
    }
  }
  return result;
}

Assistant:

UnicodeSet& Transliterator::getSourceSet(UnicodeSet& result) const {
    handleGetSourceSet(result);
    if (filter != NULL) {
        UnicodeSet* filterSet = dynamic_cast<UnicodeSet*>(filter);
        UBool deleteFilterSet = FALSE;
        // Most, but not all filters will be UnicodeSets.  Optimize for
        // the high-runner case.
        if (filterSet == NULL) {
            filterSet = new UnicodeSet();
            // Check null pointer
            if (filterSet == NULL) {
                return result;
            }
            deleteFilterSet = TRUE;
            filter->addMatchSetTo(*filterSet);
        }
        result.retainAll(*filterSet);
        if (deleteFilterSet) {
            delete filterSet;
        }
    }
    return result;
}